

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::cureLocalIntersections(Earcut<unsigned_int> *this,Node *start)

{
  Node *pNVar1;
  Node *q2;
  Node *pNVar2;
  Node *pNVar3;
  bool bVar4;
  uint *puVar5;
  Node *pNVar6;
  iterator iVar7;
  
  pNVar6 = start;
  do {
    pNVar1 = pNVar6->prev;
    q2 = pNVar6->next->next;
    if ((pNVar1->x != q2->x) || (NAN(pNVar1->x) || NAN(q2->x))) {
LAB_0014a234:
      bVar4 = intersects(this,pNVar1,pNVar6,pNVar6->next,q2);
      if (((bVar4) && (bVar4 = locallyInside(this,pNVar1,q2), bVar4)) &&
         (bVar4 = locallyInside(this,q2,pNVar1), bVar4)) {
        iVar7._M_current =
             (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        puVar5 = (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (iVar7._M_current == puVar5) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar7,&pNVar1->i);
          iVar7._M_current =
               (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          puVar5 = (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar7._M_current = pNVar1->i;
          iVar7._M_current = iVar7._M_current + 1;
          (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current;
        }
        if (iVar7._M_current == puVar5) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar7,&pNVar6->i);
          iVar7._M_current =
               (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          puVar5 = (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar7._M_current = pNVar6->i;
          iVar7._M_current = iVar7._M_current + 1;
          (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current;
        }
        if (iVar7._M_current == puVar5) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar7,&q2->i);
        }
        else {
          *iVar7._M_current = q2->i;
          (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        pNVar1 = pNVar6->prev;
        pNVar2 = pNVar6->next;
        pNVar2->prev = pNVar1;
        pNVar1->next = pNVar2;
        pNVar3 = pNVar6->prevZ;
        pNVar6 = pNVar6->nextZ;
        if (pNVar3 != (Node *)0x0) {
          pNVar3->nextZ = pNVar6;
        }
        if (pNVar6 != (Node *)0x0) {
          pNVar6->prevZ = pNVar3;
        }
        pNVar6 = pNVar2->next;
        pNVar6->prev = pNVar1;
        pNVar1->next = pNVar6;
        pNVar1 = pNVar2->prevZ;
        pNVar2 = pNVar2->nextZ;
        if (pNVar1 != (Node *)0x0) {
          pNVar1->nextZ = pNVar2;
        }
        start = q2;
        pNVar6 = q2;
        if (pNVar2 != (Node *)0x0) {
          pNVar2->prevZ = pNVar1;
        }
      }
    }
    else if ((pNVar1->y != q2->y) || (NAN(pNVar1->y) || NAN(q2->y))) goto LAB_0014a234;
    pNVar6 = pNVar6->next;
    if (pNVar6 == start) {
      pNVar6 = filterPoints(this,pNVar6,(Node *)0x0);
      return pNVar6;
    }
  } while( true );
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::cureLocalIntersections(Node* start) {
    Node* p = start;
    do {
        Node* a = p->prev;
        Node* b = p->next->next;

        // a self-intersection where edge (v[i-1],v[i]) intersects (v[i+1],v[i+2])
        if (!equals(a, b) && intersects(a, p, p->next, b) && locallyInside(a, b) && locallyInside(b, a)) {
            indices.emplace_back(a->i);
            indices.emplace_back(p->i);
            indices.emplace_back(b->i);

            // remove two nodes involved
            removeNode(p);
            removeNode(p->next);

            p = start = b;
        }
        p = p->next;
    } while (p != start);

    return filterPoints(p);
}